

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_world_level(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  char *__s1;
  char *__s1_00;
  void *pvVar4;
  level *v;
  level **pplVar5;
  
  wVar1 = parser_getint(p,"depth");
  pcVar3 = parser_getsym(p,"name");
  __s1 = parser_getsym(p,"up");
  __s1_00 = parser_getsym(p,"down");
  pvVar4 = parser_priv(p);
  v = (level *)mem_zalloc(0x28);
  if (pvVar4 == (void *)0x0) {
    pplVar5 = &world;
  }
  else {
    pplVar5 = (level **)((long)pvVar4 + 0x20);
  }
  *pplVar5 = v;
  v->depth = wVar1;
  pcVar3 = string_make(pcVar3);
  v->name = pcVar3;
  iVar2 = strcmp(__s1,"None");
  if (iVar2 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = string_make(__s1);
  }
  v->up = pcVar3;
  iVar2 = strcmp(__s1_00,"None");
  if (iVar2 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = string_make(__s1_00);
  }
  v->down = pcVar3;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_world_level(struct parser *p) {
	const int depth = parser_getint(p, "depth");
	const char *name = parser_getsym(p, "name");
	const char *up = parser_getsym(p, "up");
	const char *down = parser_getsym(p, "down");
	struct level *last = parser_priv(p);
	struct level *lev = mem_zalloc(sizeof *lev);

	if (last) {
		last->next = lev;
	} else {
		world = lev;
	}
	lev->depth = depth;
	lev->name = string_make(name);
	lev->up = streq(up, "None") ? NULL : string_make(up);
	lev->down = streq(down, "None") ? NULL : string_make(down);
	parser_setpriv(p, lev);
	return PARSE_ERROR_NONE;
}